

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tree_state_pop(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current->layout;
    pnVar1->at_x = pnVar1->at_x - ((ctx->style).tab.indent + (float)*pnVar1->offset_x);
    (pnVar1->bounds).w =
         (ctx->style).tab.indent + (ctx->style).window.padding.x + (pnVar1->bounds).w;
    (pnVar1->row).tree_depth = (pnVar1->row).tree_depth + -1;
  }
  return;
}

Assistant:

NK_API void
nk_tree_state_pop(struct nk_context *ctx)
{
struct nk_window *win = 0;
struct nk_panel *layout = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
layout->at_x -= ctx->style.tab.indent + (float)*layout->offset_x;
layout->bounds.w += ctx->style.tab.indent + ctx->style.window.padding.x;
NK_ASSERT(layout->row.tree_depth);
layout->row.tree_depth--;
}